

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

void lyxml_correct_elem_ns(ly_ctx *ctx,lyxml_elem *elem,int copy_ns,int correct_attrs)

{
  lyxml_elem *attr_parent;
  lyxml_ns *plVar1;
  lyxml_attr *plVar2;
  lyxml_elem *plVar3;
  lyxml_elem *plVar4;
  lyxml_attr **pplVar5;
  
  plVar3 = elem;
  do {
    attr_parent = plVar3;
    plVar3 = attr_parent->parent;
    plVar4 = elem;
  } while (plVar3 != (lyxml_elem *)0x0);
  do {
    plVar3 = plVar4;
    if (plVar3 == (lyxml_elem *)0x0) {
      return;
    }
    plVar2 = (lyxml_attr *)plVar3->ns;
    if (plVar2 != (lyxml_attr *)0x0) {
      if (copy_ns == 0) {
        plVar2 = (lyxml_attr *)0x0;
      }
      else {
        plVar1 = lyxml_get_ns(plVar3,plVar2->name);
        plVar3->ns = plVar1;
        if (plVar1 != (lyxml_ns *)0x0) goto LAB_0011e83b;
        plVar2 = lyxml_dup_attr(ctx,plVar3,plVar2);
      }
      plVar3->ns = (lyxml_ns *)plVar2;
    }
LAB_0011e83b:
    if (correct_attrs != 0) {
      pplVar5 = &plVar3->attr;
      while (plVar2 = *pplVar5, plVar2 != (lyxml_attr *)0x0) {
        lyxml_correct_attr_ns(ctx,plVar2,attr_parent,copy_ns);
        pplVar5 = &plVar2->next;
      }
    }
    plVar4 = plVar3->child;
    if (plVar4 == (lyxml_elem *)0x0) {
      if (plVar3 != elem) goto LAB_0011e87b;
      return;
    }
    while ((plVar4 == (lyxml_elem *)0x0 && (plVar3 = plVar3->parent, plVar3->parent != elem->parent)
           )) {
LAB_0011e87b:
      plVar4 = plVar3->next;
    }
  } while( true );
}

Assistant:

void
lyxml_correct_elem_ns(struct ly_ctx *ctx, struct lyxml_elem *elem, int copy_ns, int correct_attrs)
{
    const struct lyxml_ns *tmp_ns;
    struct lyxml_elem *elem_root, *ns_root, *tmp, *iter;
    struct lyxml_attr *attr;

    /* find the root of elem */
    for (elem_root = elem; elem_root->parent; elem_root = elem_root->parent);

    LY_TREE_DFS_BEGIN(elem, tmp, iter) {
        if (iter->ns) {
            /* find the root of elem NS */
            for (ns_root = iter->ns->parent; ns_root; ns_root = ns_root->parent);

            /* elem NS is defined outside elem subtree */
            if (ns_root != elem_root) {
                if (copy_ns) {
                    tmp_ns = iter->ns;
                    /* we may have already copied the NS over? */
                    iter->ns = lyxml_get_ns(iter, tmp_ns->prefix);

                    /* we haven't copied it over, copy it now */
                    if (!iter->ns) {
                        iter->ns = (struct lyxml_ns *)lyxml_dup_attr(ctx, iter, (struct lyxml_attr *)tmp_ns);
                    }
                } else {
                    iter->ns = NULL;
                }
            }
        }
        if (correct_attrs) {
            LY_TREE_FOR(iter->attr, attr) {
                lyxml_correct_attr_ns(ctx, attr, elem_root, copy_ns);
            }
        }
        LY_TREE_DFS_END(elem, tmp, iter);
    }
}